

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O2

int Curl_pgrsUpdate(Curl_easy *data)

{
  FILE *whereto;
  _Bool _Var1;
  int iVar2;
  long seconds;
  int iVar3;
  uint uVar4;
  curl_off_t seconds_00;
  ulong bytes;
  curltime now;
  long local_c8;
  char local_b6 [10];
  char time_total [10];
  char time_left [10];
  char max5 [6] [10];
  pgrs_estimate ul_estm;
  pgrs_estimate dl_estm;
  
  now = Curl_now();
  _Var1 = progress_calc(data,now);
  if (((data->progress).flags & 0x10) != 0) {
    return 0;
  }
  if ((data->set).fxferinfo == (curl_xferinfo_callback)0x0) {
    if ((data->set).fprogress == (curl_progress_callback)0x0) {
      if (!_Var1) {
        return 0;
      }
      goto LAB_00146a69;
    }
    Curl_set_in_callback(data,true);
    iVar2 = (*(data->set).fprogress)
                      ((data->set).progress_client,(double)(data->progress).dl.total_size,
                       (double)(data->progress).dl.cur_size,(double)(data->progress).ul.total_size,
                       (double)(data->progress).ul.cur_size);
  }
  else {
    Curl_set_in_callback(data,true);
    iVar2 = (*(data->set).fxferinfo)
                      ((data->set).progress_client,(data->progress).dl.total_size,
                       (data->progress).dl.cur_size,(data->progress).ul.total_size,
                       (data->progress).ul.cur_size);
  }
  Curl_set_in_callback(data,false);
  if ((iVar2 != 0) && (iVar2 != 0x10000001)) {
    Curl_failf(data,"Callback aborted");
  }
  iVar3 = 0;
  if (iVar2 != 0x10000001) {
    iVar3 = iVar2;
  }
  if (iVar2 != 0x10000001 || !_Var1) {
    return iVar3;
  }
LAB_00146a69:
  seconds = (data->progress).timespent / 1000000;
  uVar4 = (data->progress).flags;
  if (-1 < (char)uVar4) {
    if ((data->state).resume_from != 0) {
      curl_mfprintf((data->set).err,"** Resuming transfer from byte position %ld\n");
    }
    curl_mfprintf((data->set).err,
                  "  %% Total    %% Received %% Xferd  Average Speed   Time    Time     Time  Current\n                                 Dload  Upload   Total   Spent    Left  Speed\n"
                 );
    uVar4 = (data->progress).flags | 0x80;
    (data->progress).flags = uVar4;
  }
  pgrs_estimates(&(data->progress).ul,SUB41((uVar4 & 0x20) >> 5,0),&ul_estm);
  pgrs_estimates(&(data->progress).dl,SUB41((uVar4 & 0x40) >> 6,0),&dl_estm);
  if (dl_estm.secs < ul_estm.secs) {
    dl_estm.secs = ul_estm.secs;
  }
  seconds_00 = 0;
  if (0 < dl_estm.secs) {
    seconds_00 = dl_estm.secs - seconds;
  }
  time2str(time_left,seconds_00);
  time2str(time_total,dl_estm.secs);
  time2str(local_b6,seconds);
  uVar4 = (data->progress).flags;
  bytes = (&(data->progress).dl.total_size)[(uVar4 & 0x40) == 0] +
          (&(data->progress).ul.total_size)[(uVar4 & 0x20) == 0];
  local_c8 = (data->progress).ul.cur_size + (data->progress).dl.cur_size;
  if ((long)bytes < 0x2711) {
    if ((long)bytes < 1) {
      local_c8 = 0;
    }
    else {
      local_c8 = (local_c8 * 100) / (long)bytes;
    }
  }
  else {
    local_c8 = local_c8 / (long)(bytes / 100);
  }
  whereto = (data->set).err;
  max5data(bytes,max5[2]);
  max5data((data->progress).dl.cur_size,max5[0]);
  max5data((data->progress).ul.cur_size,max5[1]);
  max5data((data->progress).dl.speed,max5[3]);
  max5data((data->progress).ul.speed,max5[4]);
  max5data((data->progress).current_speed,max5[5]);
  curl_mfprintf(whereto,"\r%3ld %s  %3ld %s  %3ld %s  %s  %s %s %s %s %s",local_c8,max5 + 2,
                dl_estm.percent,max5,ul_estm.percent,max5 + 1,max5 + 3,max5 + 4,time_total,local_b6,
                time_left,max5 + 5);
  fflush((FILE *)(data->set).err);
  return 0;
}

Assistant:

int Curl_pgrsUpdate(struct Curl_easy *data)
{
  struct curltime now = Curl_now(); /* what time is it */
  bool showprogress = progress_calc(data, now);
  return pgrsupdate(data, showprogress);
}